

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::LocalAppend
          (DataTable *this,TableCatalogEntry *table,ClientContext *context,DataChunk *chunk,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints,Vector *row_ids,DataChunk *delete_chunk)

{
  int iVar1;
  undefined4 extraout_var;
  LocalAppendState local_140;
  
  LocalAppendState::LocalAppendState(&local_140);
  iVar1 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])(table);
  InitializeLocalAppend
            ((DataTable *)CONCAT44(extraout_var,iVar1),&local_140,table,context,bound_constraints);
  LocalTableStorage::AppendToDeleteIndexes(local_140.storage,row_ids,delete_chunk);
  LocalAppend((DataTable *)CONCAT44(extraout_var,iVar1),&local_140,context,chunk,false);
  LocalStorage::FinalizeAppend(&local_140);
  LocalAppendState::~LocalAppendState(&local_140);
  return;
}

Assistant:

void DataTable::LocalAppend(TableCatalogEntry &table, ClientContext &context, DataChunk &chunk,
                            const vector<unique_ptr<BoundConstraint>> &bound_constraints, Vector &row_ids,
                            DataChunk &delete_chunk) {
	LocalAppendState append_state;
	auto &storage = table.GetStorage();
	storage.InitializeLocalAppend(append_state, table, context, bound_constraints);
	append_state.storage->AppendToDeleteIndexes(row_ids, delete_chunk);

	storage.LocalAppend(append_state, context, chunk, false);
	storage.FinalizeLocalAppend(append_state);
}